

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanCommandBuffer.hpp
# Opt level: O0

void __thiscall
VulkanUtilities::VulkanCommandBuffer::BindComputePipeline
          (VulkanCommandBuffer *this,VkPipeline ComputePipeline)

{
  Char *Message;
  char (*in_RCX) [32];
  undefined1 local_38 [8];
  string msg;
  VkPipeline ComputePipeline_local;
  VulkanCommandBuffer *this_local;
  
  msg.field_2._8_8_ = ComputePipeline;
  if (this->m_VkCmdBuffer == (VkCommandBuffer)0x0) {
    Diligent::FormatString<char[26],char[32]>
              ((string *)local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_VkCmdBuffer != VK_NULL_HANDLE",in_RCX);
    Message = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (Message,"BindComputePipeline",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0x197);
    std::__cxx11::string::~string((string *)local_38);
  }
  if ((this->m_State).ComputePipeline != (VkPipeline)msg.field_2._8_8_) {
    (*vkCmdBindPipeline)
              (this->m_VkCmdBuffer,VK_PIPELINE_BIND_POINT_COMPUTE,(VkPipeline)msg.field_2._8_8_);
    (this->m_State).ComputePipeline = (VkPipeline)msg.field_2._8_8_;
  }
  return;
}

Assistant:

__forceinline void BindComputePipeline(VkPipeline ComputePipeline)
    {
        // 9.8
        VERIFY_EXPR(m_VkCmdBuffer != VK_NULL_HANDLE);
        if (m_State.ComputePipeline != ComputePipeline)
        {
            vkCmdBindPipeline(m_VkCmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, ComputePipeline);
            m_State.ComputePipeline = ComputePipeline;
        }
    }